

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSpaceType::IfcSpaceType(IfcSpaceType *this)

{
  IfcSpaceType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcSpaceType");
  IfcSpatialStructureElementType::IfcSpatialStructureElementType
            ((IfcSpatialStructureElementType *)this,&PTR_construction_vtable_24__00e253b0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>,
             &PTR_construction_vtable_24__00e254e8);
  *(undefined8 *)this = 0xe25280;
  *(undefined8 *)&this->field_0x1c0 = 0xe25398;
  *(undefined8 *)&this->field_0x88 = 0xe252a8;
  *(undefined8 *)&this->field_0x98 = 0xe252d0;
  *(undefined8 *)&this->field_0xf0 = 0xe252f8;
  *(undefined8 *)&this->field_0x148 = 0xe25320;
  *(undefined8 *)&this->field_0x180 = 0xe25348;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xe25370;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>).field_0x10);
  return;
}

Assistant:

IfcSpaceType() : Object("IfcSpaceType") {}